

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O0

void __thiscall sf2cute::SFInstrument::AddZone(SFInstrument *this,SFInstrumentZone *zone)

{
  bool bVar1;
  SFInstrument *pSVar2;
  invalid_argument *this_00;
  SoundFont *this_01;
  undefined1 local_40 [8];
  SFInstrumentZone *local_18;
  SFInstrumentZone *zone_local;
  SFInstrument *this_local;
  
  local_18 = zone;
  zone_local = (SFInstrumentZone *)this;
  bVar1 = SFInstrumentZone::has_parent_instrument(zone);
  if (bVar1) {
    pSVar2 = SFInstrumentZone::parent_instrument(zone);
    if (pSVar2 != this) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"Instrument zone has already been owned by another instrument.");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  else {
    SFInstrumentZone::set_parent_instrument(zone,this);
    bVar1 = has_parent_file(this);
    if ((bVar1) && (bVar1 = SFInstrumentZone::has_sample(zone), bVar1)) {
      this_01 = parent_file(this);
      SFInstrumentZone::sample((SFInstrumentZone *)&stack0xffffffffffffffc8);
      SoundFont::AddSample(this_01,(shared_ptr<sf2cute::SFSample> *)&stack0xffffffffffffffc8);
      std::shared_ptr<sf2cute::SFSample>::~shared_ptr
                ((shared_ptr<sf2cute::SFSample> *)&stack0xffffffffffffffc8);
    }
    std::make_unique<sf2cute::SFInstrumentZone,sf2cute::SFInstrumentZone>
              ((SFInstrumentZone *)local_40);
    std::
    vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
    ::push_back(&this->zones_,(value_type *)local_40);
    std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>::
    ~unique_ptr((unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                 *)local_40);
  }
  return;
}

Assistant:

void SFInstrument::AddZone(SFInstrumentZone zone) {
  // Check the parent instrument of the zone.
  if (zone.has_parent_instrument()) {
    if (&zone.parent_instrument() == this) {
      // If the zone is already be owned by this instrument, do nothing.
      return;
    }
    else {
      // Otherwise raise an error. A zone cannot be shared by two parents.
      throw std::invalid_argument("Instrument zone has already been owned by another instrument.");
    }
  }

  // Set this instrument to the parent instrument of the zone.
  zone.set_parent_instrument(*this);

  // If the zone has an orphan sample, add it to the parent file.
  if (has_parent_file()) {
    if (zone.has_sample()) {
      parent_file().AddSample(zone.sample());
    }
  }

  // Add the zone to the list.
  zones_.push_back(std::make_unique<SFInstrumentZone>(std::move(zone)));
}